

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void convertRGBA64PMToRGBA32F(QRgbaFloat32 *buffer,quint64 *src,int count)

{
  float *pfVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  QRgbaFloat<float> QVar6;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)count;
  if (count < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 * 8 != uVar4; uVar4 = uVar4 + 8) {
    uVar2 = *(undefined8 *)((long)src + uVar4);
    QVar6 = QRgbaFloat<float>::fromRgba64
                      ((quint16)uVar2,(quint16)((ulong)uVar2 >> 0x10),
                       (quint16)((ulong)uVar2 >> 0x20),(quint16)((ulong)uVar2 >> 0x30));
    fVar5 = QVar6.a;
    pfVar1 = (float *)((long)&buffer->r + uVar4 * 2);
    *pfVar1 = QVar6.r * fVar5;
    pfVar1[1] = QVar6.g * fVar5;
    pfVar1[2] = fVar5 * QVar6.b;
    pfVar1[3] = fVar5;
  }
  return;
}

Assistant:

static void QT_FASTCALL convertRGBA64PMToRGBA32F(QRgbaFloat32 *buffer, const quint64 *src, int count)
{
    const auto *in = reinterpret_cast<const QRgba64 *>(src);
    for (int i = 0; i < count; ++i) {
        auto c = in[i];
        buffer[i] = QRgbaFloat32::fromRgba64(c.red(), c.green(), c.blue(), c.alpha()).premultiplied();
    }
}